

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

bool __thiscall
miniros::MasterLink::getParamImpl<std::__cxx11::string>
          (MasterLink *this,string *key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vec,bool cached)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Type *pTVar4;
  XmlRpcValue *this_00;
  reference this_01;
  byte in_CL;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  int i;
  RpcValue xml_array;
  undefined1 in_stack_00000407;
  RpcValue *in_stack_00000408;
  string *in_stack_00000410;
  MasterLink *in_stack_00000418;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  XmlRpcValue *in_stack_ffffffffffffff40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__new_size;
  undefined4 in_stack_ffffffffffffff60;
  XmlRpcValue *in_stack_ffffffffffffff88;
  string local_70 [36];
  int local_4c;
  undefined4 local_48;
  XmlRpcValue local_38;
  byte local_21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  byte local_1;
  
  local_21 = in_CL & 1;
  local_20 = in_RDX;
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_38);
  bVar1 = getParamImpl(in_stack_00000418,in_stack_00000410,in_stack_00000408,(bool)in_stack_00000407
                      );
  if (bVar1) {
    pTVar4 = XmlRpc::XmlRpcValue::getType(&local_38);
    if (*pTVar4 == TypeArray) {
      __new_size = local_20;
      iVar2 = XmlRpc::XmlRpcValue::size(in_stack_ffffffffffffff88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(iVar2,in_stack_ffffffffffffff60),(size_type)__new_size);
      local_4c = 0;
      while( true ) {
        iVar2 = local_4c;
        iVar3 = XmlRpc::XmlRpcValue::size(in_stack_ffffffffffffff88);
        if (iVar3 <= iVar2) break;
        this_00 = XmlRpc::XmlRpcValue::operator[]
                            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        pTVar4 = XmlRpc::XmlRpcValue::getType(this_00);
        bVar1 = xml_castable<std::__cxx11::string>(*pTVar4);
        if (!bVar1) {
          local_1 = 0;
          goto LAB_00460a21;
        }
        in_stack_ffffffffffffff40 =
             XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        XmlRpc::XmlRpcValue::XmlRpcValue
                  (in_stack_ffffffffffffff40,
                   (XmlRpcValue *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        xml_cast<std::__cxx11::string>(this_00);
        this_01 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](local_20,(long)local_4c);
        std::__cxx11::string::operator=((string *)this_01,local_70);
        std::__cxx11::string::~string(local_70);
        XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4609de);
        local_4c = local_4c + 1;
      }
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
LAB_00460a21:
  local_48 = 1;
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x460a2e);
  return (bool)(local_1 & 1);
}

Assistant:

bool MasterLink::getParamImpl(const std::string& key, std::vector<T>& vec, bool cached)
{
  RpcValue xml_array;
  if (!getParamImpl(key, xml_array, cached)) {
    return false;
  }

  // Make sure it's an array type
  if (xml_array.getType() != RpcValue::TypeArray) {
    return false;
  }

  // Resize the target vector (destructive)
  vec.resize(xml_array.size());

  // Fill the vector with stuff
  for (int i = 0; i < xml_array.size(); i++) {
    if (!xml_castable<T>(xml_array[i].getType())) {
      return false;
    }

    vec[i] = xml_cast<T>(xml_array[i]);
  }

  return true;
}